

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O2

wchar_t pm(char *p,char *s,wchar_t flags)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  wchar_t wVar4;
  char *pcVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char *pcVar9;
  bool bVar10;
  
  if ((*s == '.') && (s[1] == '/')) {
    s = pm_slashskip(s + 1);
  }
  if ((*p == '.') && (p[1] == '/')) {
    p = pm_slashskip(p + 1);
  }
LAB_001168dc:
  cVar1 = *p;
  if (cVar1 == '$') {
    if (((flags & 2U) != 0) && (p[1] == '\0')) {
      pcVar5 = pm_slashskip(s);
      cVar1 = *pcVar5;
LAB_00116b02:
      bVar10 = cVar1 == '\0';
      goto LAB_00116b06;
    }
LAB_001169c5:
    if (cVar1 != *s) goto LAB_00116ad5;
  }
  else if (cVar1 == '/') {
    if ((*s != '/') && (*s != '\0')) goto LAB_00116ad5;
    pcVar5 = pm_slashskip(p);
    pcVar9 = pm_slashskip(s);
    if (((flags & 2U) != 0) && (*pcVar5 == '\0')) goto LAB_00116ab1;
    p = pcVar5 + -1;
    s = pcVar9 + -1;
  }
  else if (cVar1 == '?') {
    if (*s == '\0') goto LAB_00116ad5;
  }
  else {
    if (cVar1 == '[') {
      pcVar5 = p + 1;
      pcVar9 = pcVar5;
      do {
        cVar1 = *pcVar9;
        if (cVar1 == '\\') {
          if (pcVar9[1] != '\0') {
            pcVar9 = pcVar9 + 1;
          }
        }
        else {
          if (cVar1 == '\0') {
            if (*s != '[') goto LAB_00116ad5;
            goto LAB_00116a91;
          }
          if (cVar1 == ']') goto LAB_001169d5;
        }
        pcVar9 = pcVar9 + 1;
      } while( true );
    }
    if (cVar1 != '\\') {
      if (cVar1 == '\0') {
        cVar1 = *s;
        if (cVar1 != '/') goto LAB_00116b02;
        bVar10 = true;
        if ((flags & 2U) != 0) goto LAB_00116b06;
        pcVar5 = pm_slashskip(s);
        cVar1 = *pcVar5;
        goto LAB_00116b02;
      }
      if (cVar1 != '*') goto LAB_001169c5;
      cVar1 = '*';
      while (cVar1 == '*') {
        pcVar5 = p + 1;
        p = p + 1;
        cVar1 = *pcVar5;
      }
      if (cVar1 == '\0') {
LAB_00116ab1:
        bVar10 = true;
      }
      else {
        while (bVar10 = *s != '\0', bVar10) {
          wVar4 = __archive_pathmatch(p,s,flags);
          s = s + 1;
          if (wVar4 != L'\0') break;
        }
      }
      goto LAB_00116b06;
    }
    if (p[1] == '\0') {
      if (*s == '\\') goto LAB_00116a91;
      goto LAB_00116ad5;
    }
    if (p[1] != *s) goto LAB_00116ad5;
    p = p + 1;
  }
LAB_00116a91:
  p = p + 1;
  s = s + 1;
  goto LAB_001168dc;
LAB_001169d5:
  bVar3 = false;
  bVar2 = true;
  bVar10 = bVar2;
  if (((*pcVar5 == '^') || (*pcVar5 == '!')) && (bVar3 = false, pcVar5 < pcVar9)) {
    pcVar5 = p + 2;
    bVar10 = false;
    bVar3 = bVar2;
  }
  cVar1 = *s;
  cVar6 = '\0';
  for (; bVar2 = bVar3, pcVar5 < pcVar9; pcVar5 = pcVar5 + 1) {
    cVar7 = *pcVar5;
    bVar2 = bVar10;
    if (cVar7 == '\\') {
      cVar7 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
LAB_00116a5e:
      if (cVar7 == cVar1) break;
    }
    else {
      if (cVar7 != '-') goto LAB_00116a5e;
      if ((cVar6 == '\0') || (pcVar5 == pcVar9 + -1)) {
        if (cVar1 == '-') break;
        cVar7 = '\0';
      }
      else {
        cVar8 = pcVar5[1];
        if (cVar8 == '\\') {
          cVar8 = pcVar5[2];
          pcVar5 = pcVar5 + 2;
        }
        else {
          pcVar5 = pcVar5 + 1;
        }
        cVar7 = '\0';
        if ((cVar6 <= cVar1) && (cVar1 <= cVar8)) break;
      }
    }
    cVar6 = cVar7;
  }
  p = pcVar9;
  if (!bVar2) goto LAB_00116ad5;
  goto LAB_00116a91;
LAB_00116ad5:
  bVar10 = false;
LAB_00116b06:
  return (wchar_t)bVar10;
}

Assistant:

static int
pm(const char *p, const char *s, int flags)
{
	const char *end;

	/*
	 * Ignore leading './', './/', '././', etc.
	 */
	if (s[0] == '.' && s[1] == '/')
		s = pm_slashskip(s + 1);
	if (p[0] == '.' && p[1] == '/')
		p = pm_slashskip(p + 1);

	for (;;) {
		switch (*p) {
		case '\0':
			if (s[0] == '/') {
				if (flags & PATHMATCH_NO_ANCHOR_END)
					return (1);
				/* "dir" == "dir/" == "dir/." */
				s = pm_slashskip(s);
			}
			return (*s == '\0');
		case '?':
			/* ? always succeeds, unless we hit end of 's' */
			if (*s == '\0')
				return (0);
			break;
		case '*':
			/* "*" == "**" == "***" ... */
			while (*p == '*')
				++p;
			/* Trailing '*' always succeeds. */
			if (*p == '\0')
				return (1);
			while (*s) {
				if (archive_pathmatch(p, s, flags))
					return (1);
				++s;
			}
			return (0);
		case '[':
			/*
			 * Find the end of the [...] character class,
			 * ignoring \] that might occur within the class.
			 */
			end = p + 1;
			while (*end != '\0' && *end != ']') {
				if (*end == '\\' && end[1] != '\0')
					++end;
				++end;
			}
			if (*end == ']') {
				/* We found [...], try to match it. */
				if (!pm_list(p + 1, end, *s, flags))
					return (0);
				p = end; /* Jump to trailing ']' char. */
				break;
			} else
				/* No final ']', so just match '['. */
				if (*p != *s)
					return (0);
			break;
		case '\\':
			/* Trailing '\\' matches itself. */
			if (p[1] == '\0') {
				if (*s != '\\')
					return (0);
			} else {
				++p;
				if (*p != *s)
					return (0);
			}
			break;
		case '/':
			if (*s != '/' && *s != '\0')
				return (0);
			/* Note: pattern "/\./" won't match "/";
			 * pm_slashskip() correctly stops at backslash. */
			p = pm_slashskip(p);
			s = pm_slashskip(s);
			if (*p == '\0' && (flags & PATHMATCH_NO_ANCHOR_END))
				return (1);
			--p; /* Counteract the increment below. */
			--s;
			break;
		case '$':
			/* '$' is special only at end of pattern and only
			 * if PATHMATCH_NO_ANCHOR_END is specified. */
			if (p[1] == '\0' && (flags & PATHMATCH_NO_ANCHOR_END)){
				/* "dir" == "dir/" == "dir/." */
				return (*pm_slashskip(s) == '\0');
			}
			/* Otherwise, '$' is not special. */
			/* FALL THROUGH */
		default:
			if (*p != *s)
				return (0);
			break;
		}
		++p;
		++s;
	}
}